

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O2

void __thiscall
density::
conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>_>
::reentrant_consume_operation::cancel(reentrant_consume_operation *this)

{
  pthread_mutex_t *__mutex;
  
  if ((this->m_consume_operation).m_control == (ControlBlock *)0x0) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/conc_heter_queue.h"
               ,0x5e1);
  }
  __mutex = (pthread_mutex_t *)this->m_queue;
  std::mutex::lock((mutex *)&__mutex->__data);
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_consume_operation::cancel(&this->m_consume_operation);
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void cancel() noexcept
            {
                DENSITY_ASSERT(!empty());
                std::lock_guard<std::mutex> lock(m_queue->m_mutex);
                m_consume_operation.cancel();
            }